

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall ImgfsFile::FileEntry::listentry(FileEntry *this,ImgfsFile *imgfs)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  uint uVar5;
  size_t sVar6;
  char *__format;
  anon_class_16_2_150f306b fn;
  element_type *peVar7;
  string local_118;
  string local_f8;
  exe_reconstructor exe;
  
  if (g_verbose < 2) {
    uVar5 = DirEntry::offset(&this->super_DirEntry);
    uVar1 = (this->super_DirEntry)._size;
    uVar4 = 0x4d;
    if ((this->super_DirEntry)._magic == 0xfffff6fe) {
      uVar4 = 0x46;
    }
    uVar2 = this->_sectionlist;
    uVar3 = this->_attr;
    unixtime2string_abi_cxx11_((string *)&exe,this->_filetime / 10000000 - 0x2b6109100);
    DirEntry::entstring_abi_cxx11_(&local_118,&this->super_DirEntry);
    nameinfo::name_abi_cxx11_(&local_f8,&this->_name,imgfs);
    __format = "%08x: %c:s->%08x %9d [%08x] %s  %s %s\n";
    sVar6 = (size_t)uVar3;
    peVar7 = exe._e32rom.super___shared_ptr<exe_reconstructor::e32rom,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    exe._e32rom.super___shared_ptr<exe_reconstructor::e32rom,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_118._M_dataplus._M_p;
    local_118._M_dataplus._M_p = local_f8._M_dataplus._M_p;
  }
  else {
    sVar6 = DirEntry::calc_compressed_size(&this->super_DirEntry,imgfs);
    uVar5 = DirEntry::offset(&this->super_DirEntry);
    uVar1 = (this->super_DirEntry)._size;
    uVar4 = 0x4d;
    if ((this->super_DirEntry)._magic == 0xfffff6fe) {
      uVar4 = 0x46;
    }
    uVar2 = this->_sectionlist;
    uVar3 = this->_attr;
    unixtime2string_abi_cxx11_((string *)&exe,this->_filetime / 10000000 - 0x2b6109100);
    DirEntry::entstring_abi_cxx11_(&local_118,&this->super_DirEntry);
    nameinfo::name_abi_cxx11_(&local_f8,&this->_name,imgfs);
    __format = "%08x: %c:s->%08x %9d %9d [%08x] %s  %s %s\n";
    peVar7 = (element_type *)(ulong)uVar3;
  }
  printf(__format,(ulong)uVar5,uVar4,(ulong)uVar2,(ulong)uVar1,sVar6,peVar7,
         exe._e32rom.super___shared_ptr<exe_reconstructor::e32rom,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr,local_118._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&exe);
  section_enumerator<ImgfsFile::FileEntry::listentry(ImgfsFile&)::_lambda(std::shared_ptr<ImgfsFile::SectionEntry>)_1_>
            (this,imgfs,(anon_class_8_1_a814aef0)imgfs);
  if ((g_verbose != 0) && (this->_sectionlist != 0)) {
    exe._cputype = (uint16_t)imgfs->_cputype;
    exe._rvamap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &exe._rvamap._M_t._M_impl.super__Rb_tree_header._M_header;
    exe._rvamap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    exe._rvamap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    exe._e32rom.super___shared_ptr<exe_reconstructor::e32rom,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    exe._e32rom.super___shared_ptr<exe_reconstructor::e32rom,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    exe._o32rom.
    super__Vector_base<std::shared_ptr<exe_reconstructor::o32rom>,_std::allocator<std::shared_ptr<exe_reconstructor::o32rom>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    exe._o32rom.
    super__Vector_base<std::shared_ptr<exe_reconstructor::o32rom>,_std::allocator<std::shared_ptr<exe_reconstructor::o32rom>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    exe._o32rom.
    super__Vector_base<std::shared_ptr<exe_reconstructor::o32rom>,_std::allocator<std::shared_ptr<exe_reconstructor::o32rom>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    exe._e32exe.super___shared_ptr<exe_reconstructor::e32exe,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    exe._e32exe.super___shared_ptr<exe_reconstructor::e32exe,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    exe._o32exe.
    super__Vector_base<std::shared_ptr<exe_reconstructor::o32exe>,_std::allocator<std::shared_ptr<exe_reconstructor::o32exe>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    exe._sections.
    super__Vector_base<std::shared_ptr<exe_reconstructor::sectioninfo>,_std::allocator<std::shared_ptr<exe_reconstructor::sectioninfo>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    exe._o32exe.
    super__Vector_base<std::shared_ptr<exe_reconstructor::o32exe>,_std::allocator<std::shared_ptr<exe_reconstructor::o32exe>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    exe._o32exe.
    super__Vector_base<std::shared_ptr<exe_reconstructor::o32exe>,_std::allocator<std::shared_ptr<exe_reconstructor::o32exe>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    exe._sections.
    super__Vector_base<std::shared_ptr<exe_reconstructor::sectioninfo>,_std::allocator<std::shared_ptr<exe_reconstructor::sectioninfo>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    exe._sections.
    super__Vector_base<std::shared_ptr<exe_reconstructor::sectioninfo>,_std::allocator<std::shared_ptr<exe_reconstructor::sectioninfo>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    exe._rvamap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    exe._rvamap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         exe._rvamap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    DirEntry::getdatablock((ByteVector *)&local_118,&this->super_DirEntry,imgfs);
    exe_reconstructor::add_pe_data(&exe,(ByteVector *)&local_118);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_118);
    fn.exe = &exe;
    fn.imgfs = imgfs;
    section_enumerator<ImgfsFile::FileEntry::listentry(ImgfsFile&)::_lambda(std::shared_ptr<ImgfsFile::SectionEntry>)_2_>
              (this,imgfs,fn);
    exe_reconstructor::printexe(&exe);
    exe_reconstructor::~exe_reconstructor(&exe);
  }
  return;
}

Assistant:

void listentry(ImgfsFile& imgfs)
        {
            if (g_verbose>1) {
                size_t compsize= calc_compressed_size(imgfs);
                printf("%08x: %c:s->%08x %9d %9d [%08x] %s  %s %s\n",
                        offset(), _magic==MAGIC?'F':'M', _sectionlist, _size, int(compsize), _attr,
                        unixtime2string(getunixtime()).c_str(), entstring().c_str(), _name.name(imgfs).c_str());
            }
            else {
                printf("%08x: %c:s->%08x %9d [%08x] %s  %s %s\n",
                        offset(), _magic==MAGIC?'F':'M', _sectionlist, _size, _attr,
                        unixtime2string(getunixtime()).c_str(), entstring().c_str(), _name.name(imgfs).c_str());
            }

            section_enumerator(imgfs,
                [&imgfs](SectionEntry_ptr section) {
                    section->listsection(imgfs);
                }
            );
            if (g_verbose && _sectionlist) {

                exe_reconstructor exe(imgfs.cputype());
                exe.add_pe_data(getdatablock(imgfs));
                section_enumerator(imgfs,
                    [&imgfs,&exe](SectionEntry_ptr section) {
                        exe.add_sectioninfo(section->ni().shortname(), section->size(), section->getdatareader(imgfs));
                    }
                );

                exe.printexe();
            }
        }